

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

ssize_t __thiscall rest_rpc::rpc_client::write(rpc_client *this,int __fd,void *__buf,size_t __n)

{
  char *s;
  size_type sVar1;
  ssize_t extraout_RAX;
  void *__buf_00;
  int __fd_00;
  undefined4 in_register_00000034;
  undefined4 in_R8D;
  unique_lock<std::mutex> lock;
  client_message_type msg;
  size_t size;
  client_message_type *__args;
  undefined8 local_58;
  undefined1 local_50;
  client_message_type local_48;
  sbuffer *local_20;
  undefined1 local_11;
  undefined8 local_10;
  rpc_client *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_11 = SUB81(__buf,0);
  local_48._36_4_ = in_R8D;
  local_20 = (sbuffer *)__n;
  local_8 = this;
  local_48.content.size_ = msgpack::v1::sbuffer::size((sbuffer *)__n);
  local_58 = local_10;
  local_50 = local_11;
  __args = &local_48;
  s = msgpack::v1::sbuffer::release(local_20);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)__args,s,local_48.content.size_);
  local_48.content.data_._0_4_ = local_48._36_4_;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)this,(mutex_type *)__args);
  __fd_00 = (int)&local_58;
  std::
  deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
  ::emplace_back<rest_rpc::rpc_client::client_message_type>
            ((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
              *)this,__args);
  sVar1 = std::
          deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
          ::size((deque<rest_rpc::rpc_client::client_message_type,_std::allocator<rest_rpc::rpc_client::client_message_type>_>
                  *)0x25a24d);
  if (sVar1 < 2) {
    write(this,__fd_00,__buf_00,__n);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
  return extraout_RAX;
}

Assistant:

void write(std::uint64_t req_id, request_type type,
             rpc_service::buffer_type &&message, uint32_t func_id) {
    size_t size = message.size();
    assert(size < MAX_BUF_LEN);
    client_message_type msg{req_id, type, {message.release(), size}, func_id};

    std::unique_lock<std::mutex> lock(write_mtx_);
    outbox_.emplace_back(std::move(msg));
    if (outbox_.size() > 1) {
      // outstanding async_write
      return;
    }

    write();
  }